

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_get_end_header
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  OPJ_OFF_T OVar1;
  opj_event_mgr *p_manager_local;
  opj_stream_private *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x149a,
                  "OPJ_BOOL opj_j2k_get_end_header(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager != (opj_event_mgr *)0x0) {
    if (p_stream != (opj_stream_private *)0x0) {
      OVar1 = opj_stream_tell(p_stream);
      p_j2k->cstr_index->main_head_end = OVar1;
      return 1;
    }
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x149c,
                  "OPJ_BOOL opj_j2k_get_end_header(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x149b,
                "OPJ_BOOL opj_j2k_get_end_header(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_get_end_header(opj_j2k_t *p_j2k,
                                       struct opj_stream_private *p_stream,
                                       struct opj_event_mgr * p_manager)
{
    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    OPJ_UNUSED(p_manager);

    p_j2k->cstr_index->main_head_end = opj_stream_tell(p_stream);

    return OPJ_TRUE;
}